

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O2

Promise<void> __thiscall
capnp::_::TestExtendsImpl::grault(TestExtendsImpl *this,GraultContext context)

{
  Builder builder;
  long *in_RDX;
  CallContext<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  local_60;
  Maybe<capnp::MessageSize> local_58;
  Builder local_40;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  (**(code **)(*in_RDX + 8))();
  local_58.ptr.isSet = false;
  CallContext<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  ::getResults(&local_40,&local_60,&local_58);
  builder._builder.capTable = local_40._builder.capTable;
  builder._builder.segment = local_40._builder.segment;
  builder._builder.data = local_40._builder.data;
  builder._builder.pointers = local_40._builder.pointers;
  builder._builder.dataSize = local_40._builder.dataSize;
  builder._builder.pointerCount = local_40._builder.pointerCount;
  builder._builder._38_2_ = local_40._builder._38_2_;
  initTestMessage(builder);
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestExtendsImpl::grault(GraultContext context) {
  ++callCount;
  context.releaseParams();

  initTestMessage(context.getResults());

  return kj::READY_NOW;
}